

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::unit,units::unit>(double val,unit *start,unit *result)

{
  bool bVar1;
  uint uVar2;
  unit *extraout_RDX;
  unit *extraout_RDX_00;
  unit *extraout_RDX_01;
  unit *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool local_f1;
  bool local_b1;
  double converted_val_3;
  double local_a0;
  double converted_val_2;
  unit_data base_result;
  unit_data base_start;
  unit local_88;
  double local_80;
  double genBase;
  double local_70;
  double converted_val_1;
  unit local_60;
  unit_data local_58;
  unit_data local_54;
  unit_data local_50;
  unit_data local_4c;
  double local_48;
  double keyval;
  double local_38;
  double converted_val;
  unit *local_28;
  unit *result_local;
  unit *start_local;
  double val_local;
  
  local_28 = result;
  result_local = start;
  start_local = (unit *)val;
  bVar1 = unit::operator==(start,result);
  if (((bVar1) || (bVar1 = is_default(result_local), bVar1)) ||
     (bVar1 = is_default(local_28), bVar1)) {
    return (double)start_local;
  }
  bVar1 = unit::has_e_flag(result_local);
  if (!bVar1) {
    bVar1 = unit::has_e_flag(local_28);
    local_b1 = false;
    if (!bVar1) goto LAB_001c5848;
  }
  puVar3 = result_local;
  converted_val._4_4_ = unit::base_units(local_28);
  local_b1 = unit::has_same_base(puVar3,(unit_data *)((long)&converted_val + 4));
LAB_001c5848:
  if (local_b1 != false) {
    local_38 = detail::convertFlaggedUnits<units::unit,units::unit>
                         ((double)start_local,result_local,local_28,NAN);
    uVar2 = std::isnan(local_38);
    if ((uVar2 & 1) == 0) {
      return local_38;
    }
  }
  bVar1 = unit::is_equation(result_local);
  if ((bVar1) || (bVar1 = unit::is_equation(local_28), bVar1)) {
    keyval._4_4_ = unit::base_units(result_local);
    keyval._0_4_ = unit::base_units(local_28);
    bVar1 = detail::unit_data::equivalent_non_counting
                      ((unit_data *)((long)&keyval + 4),(unit_data *)&keyval);
    puVar3 = start_local;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_4c = unit::base_units(result_local);
      dVar6 = precise::equations::convert_equnit_to_value((double)puVar3,&local_4c);
      local_48 = dVar6;
      dVar5 = unit::multiplier(result_local);
      dVar4 = unit::multiplier(local_28);
      dVar4 = (dVar6 * dVar5) / dVar4;
      local_48 = dVar4;
      local_50 = unit::base_units(local_28);
      val_local = precise::equations::convert_value_to_equnit(dVar4,&local_50);
    }
    else {
      val_local = NAN;
    }
  }
  else {
    local_54 = unit::base_units(result_local);
    local_58 = unit::base_units(local_28);
    bVar1 = detail::unit_data::operator==(&local_54,&local_58);
    puVar3 = start_local;
    if (bVar1) {
      dVar6 = unit::multiplier(result_local);
      dVar5 = unit::multiplier(local_28);
      val_local = ((double)puVar3 * dVar6) / dVar5;
    }
    else {
      bVar1 = unit::is_per_unit(result_local);
      if ((bVar1) && (bVar1 = unit::is_per_unit(local_28), bVar1)) {
        local_60 = unit_cast(result_local);
        bVar1 = unit::operator==(&local_60,(unit *)&pu);
        local_f1 = true;
        if (!bVar1) {
          converted_val_1 = (double)unit_cast(local_28);
          local_f1 = unit::operator==((unit *)&converted_val_1,(unit *)&pu);
        }
        puVar3 = start_local;
        if (local_f1 != false) {
          return (double)start_local;
        }
        genBase._4_4_ = unit::base_units(result_local);
        genBase._0_4_ = unit::base_units(local_28);
        local_70 = puconversion::knownConversions
                             ((double)puVar3,(unit_data *)((long)&genBase + 4),(unit_data *)&genBase
                             );
        uVar2 = std::isnan(local_70);
        if ((uVar2 & 1) == 0) {
          return local_70;
        }
      }
      else {
        bVar1 = unit::is_per_unit(result_local);
        if ((bVar1) || (bVar1 = unit::is_per_unit(local_28), bVar1)) {
          local_88 = unit_cast(result_local);
          _base_result = unit_cast(local_28);
          local_80 = puconversion::assumedBase(&local_88,(unit *)&base_result);
          uVar2 = std::isnan(local_80);
          if ((uVar2 & 1) == 0) {
            dVar6 = convert<units::unit,units::unit>
                              ((double)start_local,result_local,local_28,local_80);
            return dVar6;
          }
          return NAN;
        }
      }
      converted_val_2._4_4_ = unit::base_units(result_local);
      converted_val_2._0_4_ = unit::base_units(local_28);
      bVar1 = detail::unit_data::has_same_base
                        ((unit_data *)((long)&converted_val_2 + 4),(unit_data *)&converted_val_2);
      puVar3 = start_local;
      if (bVar1) {
        dVar6 = unit::multiplier(result_local);
        dVar5 = unit::multiplier(local_28);
        val_local = ((double)puVar3 * dVar6) / dVar5;
      }
      else {
        bVar1 = detail::unit_data::equivalent_non_counting
                          ((unit_data *)((long)&converted_val_2 + 4),(unit_data *)&converted_val_2);
        if (bVar1) {
          local_a0 = detail::convertCountingUnits<units::unit,units::unit>
                               ((double)start_local,result_local,local_28);
          uVar2 = std::isnan(local_a0);
          if ((uVar2 & 1) == 0) {
            return local_a0;
          }
        }
        converted_val_3._4_4_ = detail::unit_data::inv((unit_data *)&converted_val_2);
        bVar1 = detail::unit_data::has_same_base
                          ((unit_data *)((long)&converted_val_2 + 4),
                           (unit_data *)((long)&converted_val_3 + 4));
        puVar3 = start_local;
        if (bVar1) {
          dVar6 = unit::multiplier(result_local);
          dVar5 = unit::multiplier(local_28);
          val_local = 1.0 / ((double)puVar3 * dVar6 * dVar5);
        }
        else {
          bVar1 = unit::has_e_flag(result_local);
          puVar3 = extraout_RDX;
          if ((bVar1) || (bVar1 = unit::has_e_flag(local_28), puVar3 = extraout_RDX_00, bVar1)) {
            dVar6 = detail::extraValidConversions<units::unit,units::unit>
                              ((detail *)result_local,(double)start_local,local_28,puVar3);
            uVar2 = std::isnan(dVar6);
            puVar3 = extraout_RDX_01;
            if ((uVar2 & 1) == 0) {
              return dVar6;
            }
          }
          val_local = detail::otherUsefulConversions<units::unit,units::unit>
                                ((detail *)result_local,(double)start_local,local_28,puVar3);
        }
      }
    }
  }
  return val_local;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}